

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O3

string * __thiscall
GeneratorExpressionContent::ProcessArbitraryContent
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionNode *node,string *identifier,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker,const_iterator pit)

{
  pointer ppcVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  pointer ppcVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  string result;
  undefined1 local_c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  GeneratorExpressionContent *local_88;
  string *local_80;
  pointer local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a8._M_allocated_capacity = (size_type)&local_98;
  local_a8._8_8_ = 0;
  local_98._M_local_buf[0] = '\0';
  local_78 = (this->ParamChildren).
             super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_88 = this;
  local_80 = identifier;
  if (local_78 != pit._M_current) {
    while( true ) {
      ppcVar1 = ((pit._M_current)->
                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar5 = ((pit._M_current)->
                     super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar1;
          ppcVar5 = ppcVar5 + 1) {
        iVar2 = (*node->_vptr_cmGeneratorExpressionNode[3])(node);
        if ((char)iVar2 != '\0') {
          iVar2 = (*(*ppcVar5)->_vptr_cmGeneratorExpressionEvaluator[2])();
          if (iVar2 != 0) {
            local_c8._0_8_ = local_c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,local_88->StartContent,
                       local_88->StartContent + local_88->ContentLength);
            std::operator+(&local_50,"$<",local_80);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
            psVar4 = (size_type *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar4) {
              local_70.field_2._M_allocated_capacity = *psVar4;
              local_70.field_2._8_8_ = plVar3[3];
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            }
            else {
              local_70.field_2._M_allocated_capacity = *psVar4;
              local_70._M_dataplus._M_p = (pointer)*plVar3;
            }
            local_70._M_string_length = plVar3[1];
            *plVar3 = (long)psVar4;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            reportError(context,(string *)local_c8,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
            goto LAB_0043dd63;
          }
        }
        (*(*ppcVar5)->_vptr_cmGeneratorExpressionEvaluator[3])(local_c8,*ppcVar5,context,dagChecker)
        ;
        std::__cxx11::string::_M_append(local_a8._M_local_buf,local_c8._0_8_);
        if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
        }
        if (context->HadError == true) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          goto LAB_0043dd63;
        }
      }
      pit._M_current = pit._M_current + 1;
      if (pit._M_current == local_78) break;
      std::__cxx11::string::append(local_a8._M_local_buf);
    }
  }
  iVar2 = (*node->_vptr_cmGeneratorExpressionNode[3])(node);
  if ((char)iVar2 == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_allocated_capacity == &local_98) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_98._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a8._M_allocated_capacity;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_a8._8_8_;
    local_a8._8_8_ = 0;
    local_98._M_local_buf[0] = '\0';
    local_a8._M_allocated_capacity = (size_type)&local_98;
  }
  else {
    local_c8._0_8_ = (pointer)0x0;
    local_c8._8_8_ = (pointer)0x0;
    local_c8._16_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c8,(value_type *)&local_a8);
    (*node->_vptr_cmGeneratorExpressionNode[6])
              (__return_storage_ptr__,node,local_c8,context,local_88,dagChecker);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c8);
  }
LAB_0043dd63:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_allocated_capacity != &local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity,
                    CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorExpressionContent::ProcessArbitraryContent(
  const cmGeneratorExpressionNode* node, const std::string& identifier,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::vector<cmGeneratorExpressionEvaluator*> >::const_iterator
    pit) const
{
  std::string result;

  const std::vector<
    std::vector<cmGeneratorExpressionEvaluator*> >::const_iterator pend =
    this->ParamChildren.end();
  for (; pit != pend; ++pit) {
    std::vector<cmGeneratorExpressionEvaluator*>::const_iterator it =
      pit->begin();
    const std::vector<cmGeneratorExpressionEvaluator*>::const_iterator end =
      pit->end();
    for (; it != end; ++it) {
      if (node->RequiresLiteralInput()) {
        if ((*it)->GetType() != cmGeneratorExpressionEvaluator::Text) {
          reportError(context, this->GetOriginalExpression(), "$<" +
                        identifier + "> expression requires literal input.");
          return std::string();
        }
      }
      result += (*it)->Evaluate(context, dagChecker);
      if (context->HadError) {
        return std::string();
      }
    }
    if ((pit + 1) != pend) {
      result += ",";
    }
  }
  if (node->RequiresLiteralInput()) {
    std::vector<std::string> parameters;
    parameters.push_back(result);
    return node->Evaluate(parameters, context, this, dagChecker);
  }
  return result;
}